

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,VirtualInterfaceType *type,string_view param_2)

{
  FormatBuffer *pFVar1;
  char *begin;
  InstanceBodySymbol *pIVar2;
  size_type sVar3;
  pointer ppPVar4;
  long *plVar5;
  Symbol *this_00;
  Definition *pDVar6;
  TypeParameterSymbol *pTVar7;
  Type *type_00;
  ParameterSymbol *this_01;
  ConstantValue *this_02;
  long lVar8;
  format_string<const_std::basic_string_view<char>_&> fmt;
  format_string<const_std::basic_string_view<char>_&> fmt_00;
  string local_50;
  
  pFVar1 = (this->buffer)._M_t.
           super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
           _M_t.
           super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
           super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
  pDVar6 = InstanceSymbol::getDefinition(type->iface);
  begin = (pDVar6->name)._M_str;
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)pFVar1,begin,begin + (pDVar6->name)._M_len);
  pIVar2 = type->iface->body;
  sVar3 = (pIVar2->parameters).size_;
  if (sVar3 != 0) {
    ppPVar4 = (pIVar2->parameters).data_;
    ::fmt::v9::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"#(","");
    for (lVar8 = 0; sVar3 << 3 != lVar8; lVar8 = lVar8 + 8) {
      plVar5 = *(long **)((long)ppPVar4 + lVar8);
      fmt.str_.size_ = 3;
      fmt.str_.data_ = "{}=";
      FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>const&>
                ((this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,
                 (basic_string_view<char,_std::char_traits<char>_> *)(*plVar5 + 8));
      this_00 = (Symbol *)*plVar5;
      if (this_00->kind == TypeParameter) {
        pTVar7 = Symbol::as<slang::ast::TypeParameterSymbol>(this_00);
        type_00 = DeclaredType::getType(&pTVar7->targetType);
        append(this,type_00);
      }
      else {
        pFVar1 = (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
        this_01 = Symbol::as<slang::ast::ParameterSymbol>(this_00);
        this_02 = ParameterSymbol::getValue(this_01,(SourceRange)ZEXT816(0));
        ConstantValue::toString_abi_cxx11_(&local_50,this_02);
        ::fmt::v9::detail::buffer<char>::append<char>
                  ((buffer<char> *)pFVar1,local_50._M_dataplus._M_p,
                   local_50._M_dataplus._M_p + local_50._M_string_length);
        std::__cxx11::string::~string((string *)&local_50);
      }
      ::fmt::v9::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,",","");
    }
    FormatBuffer::pop_back
              ((this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl);
    ::fmt::v9::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,")","");
  }
  if (type->modport != (ModportSymbol *)0x0) {
    fmt_00.str_.size_ = 3;
    fmt_00.str_.data_ = ".{}";
    FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>const&>
              ((this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt_00,
               &(type->modport->super_Symbol).name);
  }
  return;
}

Assistant:

void TypePrinter::visit(const VirtualInterfaceType& type, string_view) {
    buffer->append(type.iface.getDefinition().name);

    auto params = type.iface.body.parameters;
    if (!params.empty()) {
        buffer->append("#(");
        for (auto param : params) {
            buffer->format("{}=", param->symbol.name);
            if (param->symbol.kind == SymbolKind::TypeParameter)
                append(param->symbol.as<TypeParameterSymbol>().targetType.getType());
            else
                buffer->append(param->symbol.as<ParameterSymbol>().getValue().toString());
            buffer->append(",");
        }

        buffer->pop_back();
        buffer->append(")");
    }

    if (type.modport)
        buffer->format(".{}", type.modport->name);
}